

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int arkRelaxCreate(ARKodeMem ark_mem,ARKRelaxFn relax_fn,ARKRelaxJacFn relax_jac_fn,
                  ARKRelaxDeltaEFn delta_e_fn,ARKRelaxGetOrderFn get_order_fn)

{
  ARKodeRelaxMem pAVar1;
  ARKRelaxDeltaEFn in_RCX;
  ARKRelaxJacFn in_RDX;
  ARKRelaxFn in_RSI;
  ARKodeMem in_RDI;
  ARKRelaxGetOrderFn in_R8;
  int local_4;
  
  if ((in_RSI == (ARKRelaxFn)0x0) && (in_RDX == (ARKRelaxJacFn)0x0)) {
    in_RDI->relax_enabled = 0;
    local_4 = 0;
  }
  else if (in_RSI == (ARKRelaxFn)0x0) {
    arkProcessError(in_RDI,-0x16,0x315,"arkRelaxCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"The relaxation function is NULL.");
    local_4 = -0x16;
  }
  else if (in_RDX == (ARKRelaxJacFn)0x0) {
    arkProcessError(in_RDI,-0x16,0x31c,"arkRelaxCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"The relaxation Jacobian function is NULL.");
    local_4 = -0x16;
  }
  else if ((in_RCX == (ARKRelaxDeltaEFn)0x0) || (in_R8 == (ARKRelaxGetOrderFn)0x0)) {
    arkProcessError(in_RDI,-0x16,0x324,"arkRelaxCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"The Delta y, Delta e, or get order function is NULL.");
    local_4 = -0x16;
  }
  else {
    if (in_RDI->relax_mem == (ARKodeRelaxMem)0x0) {
      pAVar1 = (ARKodeRelaxMem)malloc(200);
      in_RDI->relax_mem = pAVar1;
      if (in_RDI->relax_mem == (ARKodeRelaxMem)0x0) {
        return -0x14;
      }
      memset(in_RDI->relax_mem,0,200);
      in_RDI->relax_mem->max_fails = 10;
      in_RDI->relax_mem->lower_bound = 0.8;
      in_RDI->relax_mem->upper_bound = 1.2;
      in_RDI->relax_mem->eta_fail = 0.25;
      in_RDI->relax_mem->solver = ARK_RELAX_NEWTON;
      in_RDI->relax_mem->res_tol = 2.220446049250313e-15;
      in_RDI->relax_mem->rel_tol = 8.881784197001252e-16;
      in_RDI->relax_mem->abs_tol = 1e-14;
      in_RDI->relax_mem->max_iters = 10;
      in_RDI->relax_mem->relax_param_prev = 1.0;
      in_RDI->lrw = in_RDI->lrw + 0xc;
      in_RDI->liw = in_RDI->liw + 0xe;
    }
    in_RDI->relax_mem->relax_fn = in_RSI;
    in_RDI->relax_mem->relax_jac_fn = in_RDX;
    in_RDI->relax_mem->delta_e_fn = in_RCX;
    in_RDI->relax_mem->get_order_fn = in_R8;
    in_RDI->relax_enabled = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkRelaxCreate(ARKodeMem ark_mem, ARKRelaxFn relax_fn,
                   ARKRelaxJacFn relax_jac_fn, ARKRelaxDeltaEFn delta_e_fn,
                   ARKRelaxGetOrderFn get_order_fn)
{
  /* Disable relaxation if both user inputs are NULL */
  if (!relax_fn && !relax_jac_fn)
  {
    ark_mem->relax_enabled = SUNFALSE;
    return ARK_SUCCESS;
  }

  /* Ensure both the relaxation function and Jacobian are provided */
  if (!relax_fn)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The relaxation function is NULL.");
    return ARK_ILL_INPUT;
  }

  if (!relax_jac_fn)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The relaxation Jacobian function is NULL.");
    return ARK_ILL_INPUT;
  }

  /* Ensure stepper supplied inputs are provided */
  if (!delta_e_fn || !get_order_fn)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The Delta y, Delta e, or get order function is NULL.");
    return ARK_ILL_INPUT;
  }

  /* Allocate and initialize relaxation memory structure */
  if (!(ark_mem->relax_mem))
  {
    ark_mem->relax_mem = (ARKodeRelaxMem)malloc(sizeof(*(ark_mem->relax_mem)));
    if (!(ark_mem->relax_mem)) { return ARK_MEM_FAIL; }
    memset(ark_mem->relax_mem, 0, sizeof(struct ARKodeRelaxMemRec));

    /* Set defaults */
    ark_mem->relax_mem->max_fails   = ARK_RELAX_DEFAULT_MAX_FAILS;
    ark_mem->relax_mem->lower_bound = ARK_RELAX_DEFAULT_LOWER_BOUND;
    ark_mem->relax_mem->upper_bound = ARK_RELAX_DEFAULT_UPPER_BOUND;
    ark_mem->relax_mem->eta_fail    = ARK_RELAX_DEFAULT_ETA_FAIL;
    ark_mem->relax_mem->solver      = ARK_RELAX_NEWTON;
    ark_mem->relax_mem->res_tol     = ARK_RELAX_DEFAULT_RES_TOL;
    ark_mem->relax_mem->rel_tol     = ARK_RELAX_DEFAULT_REL_TOL;
    ark_mem->relax_mem->abs_tol     = ARK_RELAX_DEFAULT_ABS_TOL;
    ark_mem->relax_mem->max_iters   = ARK_RELAX_DEFAULT_MAX_ITERS;

    /* Initialize values */
    ark_mem->relax_mem->relax_param_prev = ONE;

    /* Update workspace sizes */
    ark_mem->lrw += 12;
    ark_mem->liw += 14;
  }

  /* Set function pointers */
  ark_mem->relax_mem->relax_fn     = relax_fn;
  ark_mem->relax_mem->relax_jac_fn = relax_jac_fn;
  ark_mem->relax_mem->delta_e_fn   = delta_e_fn;
  ark_mem->relax_mem->get_order_fn = get_order_fn;

  /* Enable relaxation */
  ark_mem->relax_enabled = SUNTRUE;

  return ARK_SUCCESS;
}